

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_factorization.cc
# Opt level: O0

void ipx::SolveBackward(SparseMatrix *L,SparseMatrix *U,Vector *rhs,Vector *lhs)

{
  int j_00;
  size_t sVar1;
  double *pdVar2;
  SparseMatrix *in_RCX;
  valarray<double> *in_RDX;
  double dVar3;
  SparseMatrix *this;
  Int p;
  Int j;
  Int dim;
  int in_stack_00000074;
  char *in_stack_00000078;
  char in_stack_00000087;
  Vector *in_stack_00000088;
  SparseMatrix *in_stack_00000090;
  double *in_stack_ffffffffffffffa8;
  Int j_01;
  valarray<double> *in_stack_ffffffffffffffb0;
  undefined4 local_34;
  Vector *rhs_00;
  
  sVar1 = std::valarray<double>::size(in_RDX);
  j_00 = (int)sVar1;
  rhs_00 = (Vector *)0x0;
  std::valarray<double>::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (local_34 = 0; local_34 < j_00; local_34 = local_34 + 1) {
    dVar3 = DotColumn(in_RCX,j_00,rhs_00);
    pdVar2 = std::valarray<double>::operator[]((valarray<double> *)in_RCX,(long)local_34);
    *pdVar2 = *pdVar2 - dVar3;
    pdVar2 = std::valarray<double>::operator[]((valarray<double> *)in_RCX,(long)local_34);
    j_01 = (Int)((ulong)dVar3 >> 0x20);
    this = (SparseMatrix *)
           (~-(ulong)(0.0 <= *pdVar2) & 0xbff0000000000000 |
           (ulong)((uint)(-(ulong)(0.0 <= *pdVar2) >> 0x20) & 0x3ff00000) << 0x20);
    pdVar2 = std::valarray<double>::operator[](in_RDX,(long)local_34);
    *pdVar2 = (double)this;
    pdVar2 = std::valarray<double>::operator[](in_RDX,(long)local_34);
    dVar3 = *pdVar2;
    pdVar2 = std::valarray<double>::operator[]((valarray<double> *)in_RCX,(long)local_34);
    *pdVar2 = dVar3 + *pdVar2;
    SparseMatrix::end(this,j_01);
    dVar3 = SparseMatrix::value(this,j_01);
    pdVar2 = std::valarray<double>::operator[]((valarray<double> *)in_RCX,(long)local_34);
    *pdVar2 = *pdVar2 / dVar3;
  }
  TriangularSolve(in_stack_00000090,in_stack_00000088,in_stack_00000087,in_stack_00000078,
                  in_stack_00000074);
  return;
}

Assistant:

static void SolveBackward(const SparseMatrix& L, const SparseMatrix& U,
                          Vector& rhs, Vector& lhs) {
    Int dim = rhs.size();
    lhs = 0.0;
    for (Int j = 0; j < dim; j++) {
        lhs[j] -= DotColumn(U, j, lhs);
        rhs[j] = lhs[j] >= 0.0 ? 1.0 : -1.0;
        lhs[j] += rhs[j];
        Int p = U.end(j)-1;
        assert(U.index(p) == j);
        lhs[j] /= U.value(p);
    }
    TriangularSolve(L, lhs, 't', "lower", 1);
}